

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkageUntangler.cc
# Opt level: O2

DistanceGraph * __thiscall
LinkageUntangler::make_nextselected_linkage
          (DistanceGraph *__return_storage_ptr__,LinkageUntangler *this,int min_links)

{
  LinkageUntangler *this_00;
  SequenceDistanceGraph *_sdg;
  long lVar1;
  size_type sVar2;
  pointer ppVar3;
  bool bVar4;
  pointer ppVar5;
  size_type sVar6;
  ulong __n;
  reference rVar7;
  vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> bw_sorted;
  vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> fw_sorted;
  
  _sdg = (SequenceDistanceGraph *)**(undefined8 **)this;
  std::__cxx11::string::string((string *)&fw_sorted,"unnamed",(allocator *)&bw_sorted);
  DistanceGraph::DistanceGraph(__return_storage_ptr__,_sdg,(string *)&fw_sorted);
  std::__cxx11::string::~string((string *)&fw_sorted);
  this_00 = this + 8;
  __n = 1;
  do {
    lVar1 = *(long *)(**(long **)this + 0x40);
    if ((ulong)((*(long *)(**(long **)this + 0x48) - lVar1) / 0x38) <= __n) {
      return __return_storage_ptr__;
    }
    if ((*(char *)(lVar1 + 0x20 + __n * 0x38) != '\x01') &&
       (rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)this_00,__n),
       (*rVar7._M_p & rVar7._M_mask) != 0)) {
      DistanceGraph::fw_neighbours_by_distance(&fw_sorted,*(DistanceGraph **)this,__n,min_links);
      ppVar3 = fw_sorted.
               super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (ppVar5 = fw_sorted.
                    super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar3; ppVar5 = ppVar5 + 1
          ) {
        sVar2 = ppVar5->second;
        sVar6 = -sVar2;
        if (0 < (long)sVar2) {
          sVar6 = sVar2;
        }
        if ((sVar6 != __n) &&
           (rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              ((vector<bool,_std::allocator<bool>_> *)this_00,sVar6),
           (*rVar7._M_p & rVar7._M_mask) != 0)) {
          bVar4 = DistanceGraph::are_connected(__return_storage_ptr__,-__n,ppVar5->second);
          if (!bVar4) {
            DistanceGraph::add_link
                      (__return_storage_ptr__,-__n,ppVar5->second,ppVar5->first,(Support)ZEXT816(0))
            ;
          }
          break;
        }
      }
      DistanceGraph::fw_neighbours_by_distance(&bw_sorted,*(DistanceGraph **)this,-__n,min_links);
      ppVar3 = bw_sorted.
               super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (ppVar5 = bw_sorted.
                    super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar3; ppVar5 = ppVar5 + 1
          ) {
        sVar2 = ppVar5->second;
        sVar6 = -sVar2;
        if (0 < (long)sVar2) {
          sVar6 = sVar2;
        }
        if ((sVar6 != __n) &&
           (rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              ((vector<bool,_std::allocator<bool>_> *)this_00,sVar6),
           (*rVar7._M_p & rVar7._M_mask) != 0)) {
          bVar4 = DistanceGraph::are_connected(__return_storage_ptr__,__n,ppVar5->second);
          if (!bVar4) {
            DistanceGraph::add_link
                      (__return_storage_ptr__,__n,ppVar5->second,ppVar5->first,(Support)ZEXT816(0));
          }
          break;
        }
      }
      std::_Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::~_Vector_base
                (&bw_sorted.
                  super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>);
      std::_Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>::~_Vector_base
                ((_Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> *)
                 &fw_sorted);
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

DistanceGraph LinkageUntangler::make_nextselected_linkage(int min_links) {
    DistanceGraph ldg(dg.sdg);
    for (auto n=1;n<dg.sdg.nodes.size();++n) {
        if (dg.sdg.nodes[n].status == NodeStatus::Deleted or !selected_nodes[n]) continue;
        auto fw_sorted = dg.fw_neighbours_by_distance(n, min_links);
        for (auto &fwl:fw_sorted) {
            if (llabs(fwl.second)!=n and selected_nodes[llabs(fwl.second)]) {
                if (!ldg.are_connected(-n, fwl.second)) {
                    ldg.add_link(-n, fwl.second, fwl.first);
                }
                break;
            }
        }
        auto bw_sorted = dg.fw_neighbours_by_distance(-n, min_links);
        for (auto &bwl:bw_sorted) {
            if (llabs(bwl.second)!=n and selected_nodes[llabs(bwl.second)]) {
                if (!ldg.are_connected(n, bwl.second)) {
                    ldg.add_link(n, bwl.second, bwl.first);
                }
                break;
            }
        }
    }
    return ldg;
}